

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionHandler.cpp
# Opt level: O3

void __thiscall
irr::video::COpenGL3ExtensionHandler::extensionsLoaded(COpenGL3ExtensionHandler *this)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar1;
  bool bVar2;
  char cVar3;
  undefined8 *puVar4;
  long *plVar5;
  const_iterator cVar6;
  ulong uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char cVar9;
  size_t j;
  _Hash_node_base *p_Var10;
  long lVar11;
  char *__end;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar13;
  string __str;
  key_type local_b8;
  COpenGL3ExtensionHandler *local_98;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  uint local_48;
  undefined4 uStack_44;
  ulong local_40 [2];
  
  local_70 = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Loaded ","");
  uVar1 = (this->Extensions)._M_h._M_element_count;
  cVar9 = '\x01';
  if (9 < uVar1) {
    uVar7 = uVar1;
    cVar3 = '\x04';
    do {
      cVar9 = cVar3;
      if (uVar7 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_001f7d57;
      }
      if (uVar7 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_001f7d57;
      }
      if (uVar7 < 10000) goto LAB_001f7d57;
      bVar2 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar3 = cVar9 + '\x04';
    } while (bVar2);
    cVar9 = cVar9 + '\x01';
  }
LAB_001f7d57:
  local_98 = this;
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar9);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,uVar1);
  uVar1 = CONCAT44(uStack_44,local_48) + local_68;
  uVar7 = 0xf;
  if (local_70 != local_60) {
    uVar7 = local_60[0];
  }
  if (uVar7 < uVar1) {
    uVar7 = 0xf;
    if (local_50 != local_40) {
      uVar7 = local_40[0];
    }
    if (uVar1 <= uVar7) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
      goto LAB_001f7dd9;
    }
  }
  puVar4 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
LAB_001f7dd9:
  local_90 = &local_80;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_80 = *plVar5;
    uStack_78 = puVar4[3];
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*puVar4;
  }
  local_88 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_90);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar8) {
    uVar12 = *(undefined4 *)paVar8;
    uVar13 = *(undefined4 *)((long)plVar5 + 0x14);
    local_b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_b8.field_2._8_4_ = (undefined4)plVar5[3];
    local_b8.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  }
  else {
    local_b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_b8._M_dataplus._M_p = (pointer)*plVar5;
    uVar12 = extraout_XMM0_Da;
    uVar13 = extraout_XMM0_Db;
  }
  local_b8._M_string_length = plVar5[1];
  *plVar5 = (long)paVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  os::Printer::log((Printer *)local_b8._M_dataplus._M_p,(double)CONCAT44(uVar13,uVar12));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  p_Var10 = (local_98->Extensions)._M_h._M_before_begin._M_nxt;
  if (p_Var10 != (_Hash_node_base *)0x0) {
    do {
      local_90 = &local_80;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"  ","");
      plVar5 = (long *)::std::__cxx11::string::_M_append((char *)&local_90,(ulong)p_Var10[1]._M_nxt)
      ;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar8) {
        uVar12 = *(undefined4 *)paVar8;
        uVar13 = *(undefined4 *)((long)plVar5 + 0x14);
        local_b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_b8.field_2._8_4_ = (undefined4)plVar5[3];
        local_b8.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      }
      else {
        local_b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        uVar12 = extraout_XMM0_Da_00;
        uVar13 = extraout_XMM0_Db_00;
        local_b8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_b8._M_string_length = plVar5[1];
      *plVar5 = (long)paVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      os::Printer::log((Printer *)local_b8._M_dataplus._M_p,(double)CONCAT44(uVar13,uVar12));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      p_Var10 = p_Var10->_M_nxt;
    } while (p_Var10 != (_Hash_node_base *)0x0);
  }
  this_00 = &local_98->Extensions;
  lVar11 = 0;
  do {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               (&COGLESCoreExtensionHandler::getFeatureString(unsigned_long)::OGLESFeatureStrings)
               [lVar11],(allocator<char> *)&local_90);
    cVar6 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)this_00,&local_b8);
    (local_98->super_COGLESCoreExtensionHandler).FeatureAvailable[lVar11] =
         cVar6.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur != (__node_type *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x1b);
  return;
}

Assistant:

void COpenGL3ExtensionHandler::extensionsLoaded()
{
	os::Printer::log((std::string("Loaded ") + std::to_string(Extensions.size()) + " extensions:").c_str(), ELL_DEBUG);
	for (const auto &it : Extensions)
		os::Printer::log((std::string("  ") + it).c_str(), ELL_DEBUG);
	for (size_t j = 0; j < IRR_OGLES_Feature_Count; ++j)
		FeatureAvailable[j] = queryExtension(getFeatureString(j));
}